

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::BrS(ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,byte val)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  undefined8 uStack_38;
  OpLayoutBrS data;
  
  uStack_38 = in_RAX;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x18);
  CheckLabel(this,labelID);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x313,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar2 = uStack_38;
  uStack_38._7_1_ = SUB81(uVar2,7);
  uStack_38._0_7_ = CONCAT16(val,CONCAT24(3,(undefined4)uStack_38));
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
  Data::Write(&this->m_byteCodeData,(void *)((long)&uStack_38 + 4),3);
  AddJumpOffset(this,op,labelID,3);
  return;
}

Assistant:

void ByteCodeWriter::BrS(OpCode op, ByteCodeLabel labelID, byte val)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrS);
        CheckLabel(labelID);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBrS) - offsetof(OpLayoutBrS, RelativeJumpOffset);
        OpLayoutBrS data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
        data.val = val;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }